

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper2.cpp
# Opt level: O2

void test_cpp_wrapper_equality_duplicates(planck_unit_test_t *tc,Dictionary<int,_int> *dict,int key)

{
  undefined8 uVar1;
  long lVar2;
  int *expected_values;
  int iVar3;
  ulong uVar4;
  long lVar5;
  int value;
  long lStack_50;
  ulong local_48;
  int *local_40;
  int local_34;
  
  lVar2 = -((ulong)(uint)key * 4 + 0xf & 0xfffffffffffffff0);
  local_40 = (int *)((long)&local_48 + lVar2);
  local_34 = key;
  iVar3 = 0;
  if (0 < key) {
    iVar3 = key;
  }
  local_48 = (ulong)(uint)(iVar3 * 2);
  *(undefined8 *)((long)&lStack_50 + lVar2) = 1;
  lVar5 = *(long *)((long)&lStack_50 + lVar2);
  uVar4 = 0;
  while (iVar3 = local_34, local_48 != uVar4) {
    value = (int)(uVar4 + 2);
    *(undefined8 *)((long)&lStack_50 + lVar2) = 0x10a513;
    cpp_wrapper_insert(tc,dict,iVar3,value,'\0');
    *(int *)((long)local_40 + uVar4 * 2) = value;
    *(undefined8 *)((long)&lStack_50 + lVar2) = 0x10a530;
    cpp_wrapper_insert(tc,dict,(int)lVar5 + -1,(int)uVar4,'\0');
    lVar5 = lVar5 + 1;
    uVar4 = uVar4 + 2;
  }
  *(undefined8 *)((long)&lStack_50 + lVar2) = 1;
  iVar3 = local_34;
  expected_values = local_40;
  uVar1 = *(undefined8 *)((long)&lStack_50 + lVar2);
  *(undefined8 *)((long)&lStack_50 + lVar2) = 0x10a551;
  cpp_wrapper_equality(tc,dict,iVar3,expected_values,iVar3,(ion_boolean_t)uVar1);
  return;
}

Assistant:

void
test_cpp_wrapper_equality_duplicates(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict,
	int key
) {
	int values[key];

	for (int i = 1; i <= key; i++) {
		cpp_wrapper_insert(tc, dict, key, i * 2, boolean_false);
		values[i - 1] = i * 2;

		cpp_wrapper_insert(tc, dict, i - 1, (i - 1) * 2, boolean_false);
	}

	cpp_wrapper_equality(tc, dict, key, values, key, boolean_true);
}